

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cleartext.c
# Opt level: O3

CURLcode Curl_auth_create_login_message(Curl_easy *data,char *valuep,char **outptr,size_t *outlen)

{
  CURLcode CVar1;
  size_t insize;
  char *pcVar2;
  
  insize = strlen(valuep);
  if (insize != 0) {
    CVar1 = Curl_base64_encode(data,valuep,insize,outptr,outlen);
    return CVar1;
  }
  pcVar2 = (*Curl_cstrdup)("=");
  *outptr = pcVar2;
  if (pcVar2 == (char *)0x0) {
    *outlen = 0;
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    *outlen = 1;
    CVar1 = CURLE_OK;
  }
  return CVar1;
}

Assistant:

CURLcode Curl_auth_create_login_message(struct Curl_easy *data,
                                        const char *valuep, char **outptr,
                                        size_t *outlen)
{
  size_t vlen = strlen(valuep);

  if(!vlen) {
    /* Calculate an empty reply */
    *outptr = strdup("=");
    if(*outptr) {
      *outlen = (size_t) 1;
      return CURLE_OK;
    }

    *outlen = 0;
    return CURLE_OUT_OF_MEMORY;
  }

  /* Base64 encode the value */
  return Curl_base64_encode(data, valuep, vlen, outptr, outlen);
}